

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmalloc_unittest.cc
# Opt level: O3

void TestCalloc(size_t n,size_t s,bool ok)

{
  void *__ptr;
  long lVar1;
  undefined7 in_register_00000011;
  char *pcVar2;
  code *local_30;
  
  local_30 = calloc;
  (*noopt_helper)(&local_30);
  __ptr = (void *)(*local_30)(n,s);
  if ((int)CONCAT71(in_register_00000011,ok) == 0) {
    if (__ptr != (void *)0x0) {
      pcVar2 = "Check failed: p == nullptr\n";
      goto LAB_00113433;
    }
  }
  else {
    if (__ptr == (void *)0x0) {
      pcVar2 = "Check failed: p != nullptr\n";
LAB_00113433:
      syscall(1,2,pcVar2,0x1b);
      abort();
    }
    if (s * n != 0) {
      lVar1 = 0;
      do {
        if (*(char *)((long)__ptr + lVar1) != '\0') {
          pcVar2 = "Check failed: p[i] == \'\\0\'\n";
          goto LAB_00113433;
        }
        lVar1 = lVar1 + 1;
      } while (s * n - lVar1 != 0);
    }
    free(__ptr);
  }
  return;
}

Assistant:

static void TestCalloc(size_t n, size_t s, bool ok) {
  char* p = reinterpret_cast<char*>(noopt(calloc)(n, s));
  if (!ok) {
    CHECK(p == nullptr);  // calloc(n, s) should not succeed
  } else {
    CHECK(p != nullptr);  // calloc(n, s) should succeed
    for (int i = 0; i < n*s; i++) {
      CHECK(p[i] == '\0');
    }
    free(p);
  }
}